

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

Curl_easy * Curl_multi_get_easy(Curl_multi *multi,uint mid)

{
  Curl_multi *local_30;
  Curl_easy *data;
  uint mid_local;
  Curl_multi *multi_local;
  
  if (mid == 0) {
    local_30 = (Curl_multi *)0x0;
  }
  else {
    local_30 = (Curl_multi *)Curl_uint_tbl_get(&multi->xfers,mid);
  }
  if (((local_30 == (Curl_multi *)0x0) || (local_30 == (Curl_multi *)0x0)) ||
     (local_30->magic != 0xc0dedbad)) {
    if ((((multi->admin != (Curl_easy *)0x0) &&
         ((*(ulong *)&(multi->admin->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((multi->admin->state).feat == (curl_trc_feat *)0x0 ||
         (0 < ((multi->admin->state).feat)->log_level)))) && (0 < Curl_trc_feat_multi.log_level)) {
      Curl_trc_multi(multi->admin,"invalid easy handle in xfer table for mid=%u",(ulong)mid);
    }
    Curl_uint_tbl_remove(&multi->xfers,mid);
    multi_local = (Curl_multi *)0x0;
  }
  else {
    multi_local = local_30;
  }
  return (Curl_easy *)multi_local;
}

Assistant:

struct Curl_easy *Curl_multi_get_easy(struct Curl_multi *multi,
                                      unsigned int mid)
{
  struct Curl_easy *data = mid ? Curl_uint_tbl_get(&multi->xfers, mid) : NULL;
  if(data && GOOD_EASY_HANDLE(data))
    return data;
  CURL_TRC_M(multi->admin, "invalid easy handle in xfer table for mid=%u",
             mid);
  Curl_uint_tbl_remove(&multi->xfers, mid);
  return NULL;
}